

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::HelpCommand(UCIAdapter *this,char *param_1)

{
  Output local_70 [4];
  Output local_50;
  string local_48 [32];
  string local_28 [32];
  
  Output::Output(&local_50,InfoPrefix);
  (**this->engine->_vptr_ChessEngine)(local_70);
  std::operator<<((ostream *)&std::cout,(string *)local_70);
  std::operator<<((ostream *)&std::cout,' ');
  (*this->engine->_vptr_ChessEngine[1])(local_28);
  std::operator<<((ostream *)&std::cout,local_28);
  std::operator<<((ostream *)&std::cout," by ");
  (*this->engine->_vptr_ChessEngine[2])(local_48);
  std::operator<<((ostream *)&std::cout,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string((string *)local_70);
  Output::~Output(&local_50);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"UCI commands:");
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Debug_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Go_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::IsReady_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Position_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Quit_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::SetOption_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Stop_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Uci_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::UciNewGame_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"Additional commands:");
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Exit_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Fen_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Help_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::New_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Perft_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Print_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<((ostream *)&std::cout,(string *)token::Test_abi_cxx11_);
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"Also try \'<command> help\' for help on a specific command"
                 );
  Output::~Output(local_70);
  Output::Output(local_70,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"Or enter move(s) in coordinate notation, e.g. d2d4 g8f6");
  Output::~Output(local_70);
  return;
}

Assistant:

void UCIAdapter::HelpCommand(const char* /*params*/)
{
  Output() << engine->GetEngineName() << ' ' << engine->GetEngineVersion()
           << " by " << engine->GetAuthorName();
  Output() << "UCI commands:";
  Output() << "  " << token::Debug;
  Output() << "  " << token::Go;
  Output() << "  " << token::IsReady;
  Output() << "  " << token::Position;
  Output() << "  " << token::Quit;
  Output() << "  " << token::SetOption;
  Output() << "  " << token::Stop;
  Output() << "  " << token::Uci;
  Output() << "  " << token::UciNewGame;
  Output() << "Additional commands:";
  Output() << "  " << token::Exit;
  Output() << "  " << token::Fen;
  Output() << "  " << token::Help;
  Output() << "  " << token::New;
  Output() << "  " << token::Perft;
  Output() << "  " << token::Print;
  Output() << "  " << token::Test;
  Output() << "Also try '<command> help' for help on a specific command";
  Output() << "Or enter move(s) in coordinate notation, e.g. d2d4 g8f6";
}